

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

SortOrder __thiscall QSortedModelEngine::sortOrder(QSortedModelEngine *this,QModelIndex *parent)

{
  int iVar1;
  long *plVar2;
  SortOrder SVar3;
  long in_FS_OFFSET;
  undefined1 local_b0 [24];
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QVariant local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar2 = (long *)QAbstractProxyModel::sourceModel();
  iVar1 = (**(code **)(*plVar2 + 0x78))(plVar2,parent);
  SVar3 = AscendingOrder;
  if (1 < iVar1) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d._0_4_ = 0xaaaaaaaa;
    local_78.d._4_4_ = 0xaaaaaaaa;
    local_78.ptr._0_4_ = 0xaaaaaaaa;
    local_78.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*plVar2 + 0x60))
              (&local_98,plVar2,0,((this->super_QCompletionEngine).c)->column,parent);
    (**(code **)(*plVar2 + 0x90))
              (&local_58,plVar2,&local_98,((this->super_QCompletionEngine).c)->role);
    ::QVariant::toString();
    ::QVariant::~QVariant(&local_58);
    local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d._0_4_ = 0xaaaaaaaa;
    local_98.d._4_4_ = 0xaaaaaaaa;
    local_98.ptr._0_4_ = 0xaaaaaaaa;
    local_98.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*plVar2 + 0x60))
              (local_b0,plVar2,iVar1 + -1,((this->super_QCompletionEngine).c)->column,parent);
    (**(code **)(*plVar2 + 0x90))
              (&local_58,plVar2,local_b0,((this->super_QCompletionEngine).c)->role);
    ::QVariant::toString();
    ::QVariant::~QVariant(&local_58);
    iVar1 = QString::compare((QString *)&local_78,(CaseSensitivity)&local_98);
    SVar3 = (SortOrder)(0 < iVar1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return SVar3;
  }
  __stack_chk_fail();
}

Assistant:

Qt::SortOrder QSortedModelEngine::sortOrder(const QModelIndex &parent) const
{
    const QAbstractItemModel *model = c->proxy->sourceModel();

    int rowCount = model->rowCount(parent);
    if (rowCount < 2)
        return Qt::AscendingOrder;
    QString first = model->data(model->index(0, c->column, parent), c->role).toString();
    QString last = model->data(model->index(rowCount - 1, c->column, parent), c->role).toString();
    return QString::compare(first, last, c->cs) <= 0 ? Qt::AscendingOrder : Qt::DescendingOrder;
}